

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateImportTargetCode
          (cmExportBuildAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target)

{
  pointer pcVar1;
  ostream *poVar2;
  char *path_00;
  string path;
  string targetName;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78 [2];
  string local_68;
  string local_48;
  
  pcVar1 = (this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace.
           _M_dataplus._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,
             pcVar1 + (this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace
                      ._M_string_length);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_a8,target);
  std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"include $(CLEAR_VARS)\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_MODULE := ",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_88,local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_SRC_FILES := ",0x13);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  cmGeneratorTarget::GetFullPath(&local_48,target,&local_68,RuntimeBinaryArtifact,false);
  cmSystemTools::ConvertToOutputPath_abi_cxx11_
            (&local_a8,(cmSystemTools *)local_48._M_dataplus._M_p,path_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, const cmGeneratorTarget* target)
{
  std::string targetName = this->Namespace;
  targetName += target->GetExportName();
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := ";
  std::string path =
    cmSystemTools::ConvertToOutputPath(target->GetFullPath().c_str());
  os << path << "\n";
}